

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void cpp_db::bind_params(statement *stmt,initializer_list<cpp_db::parameter> params)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  undefined1 local_78 [8];
  parameter param;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<cpp_db::parameter> *__range1;
  parameters p;
  statement *stmt_local;
  initializer_list<cpp_db::parameter> params_local;
  
  params_local._M_array = (iterator)params._M_len;
  stmt_local = (statement *)params._M_array;
  p.params_impl._M_t.
  super___uniq_ptr_impl<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_cpp_db::parameters_interface_*,_std::default_delete<cpp_db::parameters_interface>_>
  .super__Head_base<0UL,_cpp_db::parameters_interface_*,_false>._M_head_impl =
       (unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
       )(unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
         )stmt;
  statement::reset(stmt);
  statement::get_parameters((statement *)&__range1);
  __end1 = std::initializer_list<cpp_db::parameter>::begin
                     ((initializer_list<cpp_db::parameter> *)&stmt_local);
  param.name.field_2._8_8_ =
       std::initializer_list<cpp_db::parameter>::end
                 ((initializer_list<cpp_db::parameter> *)&stmt_local);
  for (; __end1 != (const_iterator)param.name.field_2._8_8_; __end1 = __end1 + 1) {
    parameter::parameter((parameter *)local_78,__end1);
    parameters::bind((parameters *)&__range1,(int)local_78,__addr,in_ECX);
    parameter::~parameter((parameter *)local_78);
  }
  parameters::~parameters((parameters *)&__range1);
  return;
}

Assistant:

static void bind_params(statement &stmt, std::initializer_list<parameter> params)
{
	stmt.reset();
	parameters p(stmt.get_parameters());

	for (auto param : params)
		p.bind(param);
}